

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

Fl_Tree_Item * __thiscall Fl_Tree_Item::find_child_item(Fl_Tree_Item *this,char *name)

{
  Fl_Tree_Item **ppFVar1;
  int iVar2;
  ulong uVar3;
  Fl_Tree_Item *unaff_R14;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  if (name != (char *)0x0) {
    uVar4 = (ulong)(this->_children)._total;
    bVar5 = 0 < (long)uVar4;
    if (0 < (long)uVar4) {
      ppFVar1 = (this->_children)._items;
      uVar3 = 1;
      do {
        unaff_R14 = ppFVar1[uVar3 - 1];
        if ((unaff_R14->_label != (char *)0x0) &&
           (iVar2 = strcmp(unaff_R14->_label,name), iVar2 == 0)) break;
        bVar5 = uVar3 < uVar4;
        bVar6 = uVar3 != uVar4;
        uVar3 = uVar3 + 1;
      } while (bVar6);
    }
    if (bVar5) {
      return unaff_R14;
    }
  }
  return (Fl_Tree_Item *)0x0;
}

Assistant:

const Fl_Tree_Item* Fl_Tree_Item::find_child_item(const char *name) const {
  if ( name )
    for ( int t=0; t<children(); t++ )
      if ( child(t)->label() )
        if ( strcmp(child(t)->label(), name) == 0 )
          return(child(t));
  return(0);
}